

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::
CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test::TestBody
          (CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test *this)

{
  element_type *this_00;
  pointer *__ptr;
  char *pcVar1;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_3;
  AssertHelper local_b0;
  string uriPath;
  ByteArray expectedBuffer;
  shared_ptr<ot::commissioner::coap::Message> message;
  ContentFormat accept;
  ContentFormat contentFormat;
  ByteArray buffer;
  Error error;
  
  error.mCode = error.mCode & 0xffffff00;
  gtest_ar_3.success_ = true;
  std::
  make_shared<ot::commissioner::coap::Message,ot::commissioner::coap::Type,ot::commissioner::coap::Code>
            ((Type *)&message,(Code *)&error);
  this_00 = message.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&uriPath,".well-known/est/rv/",(allocator *)&local_b0);
  Message::SetUriPath((Error *)&gtest_ar_3,this_00,&uriPath);
  gtest_ar_11.success_ = false;
  gtest_ar_11._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&expectedBuffer,"message->SetUriPath(\".well-known/est/rv/\")",
             "ErrorCode::kNone",(Error *)&gtest_ar_3,(ErrorCode *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  std::__cxx11::string::~string((string *)&uriPath);
  if ((char)expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)expectedBuffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&uriPath,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe1,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&uriPath,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uriPath);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  Message::SetContentFormat
            ((Error *)&gtest_ar_3,
             message.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,kCBOR);
  expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&uriPath,"message->SetContentFormat(ContentFormat::kCBOR)",
             "ErrorCode::kNone",(Error *)&gtest_ar_3,(ErrorCode *)&expectedBuffer);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  if ((char)uriPath._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (uriPath._M_string_length == 0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)uriPath._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expectedBuffer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe2,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&expectedBuffer,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expectedBuffer);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uriPath._M_string_length);
  Message::SetAccept((Error *)&gtest_ar_3,
                     message.
                     super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,kCoseSign1);
  expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&uriPath,"message->SetAccept(ContentFormat::kCoseSign1)","ErrorCode::kNone"
             ,(Error *)&gtest_ar_3,(ErrorCode *)&expectedBuffer);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  if ((char)uriPath._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (uriPath._M_string_length == 0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)uriPath._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expectedBuffer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe3,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&expectedBuffer,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expectedBuffer);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uriPath._M_string_length);
  uriPath._M_dataplus._M_p =
       (pointer)((message.
                  super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->mOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_3,"message->GetOptionNum()","3",(unsigned_long *)&uriPath,
             (int *)&expectedBuffer);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&uriPath);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expectedBuffer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expectedBuffer,(Message *)&uriPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expectedBuffer);
    if (uriPath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)uriPath._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  Message::Serialize((Error *)&gtest_ar_3,
                     message.
                     super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&buffer);
  expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&uriPath,"message->Serialize(buffer)","ErrorCode::kNone",
             (Error *)&gtest_ar_3,(ErrorCode *)&expectedBuffer);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  if ((char)uriPath._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (uriPath._M_string_length == 0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)uriPath._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expectedBuffer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe5,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&expectedBuffer,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expectedBuffer);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uriPath._M_string_length);
  gtest_ar_3.success_ = true;
  gtest_ar_3._1_7_ = 0x65772ebb000001;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_3_ = 0x2d6c6c;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_5_ = 0x6e776f6e6b;
  __l._M_len = 0x1b;
  __l._M_array = &gtest_ar_3.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&expectedBuffer,__l,(allocator_type *)&uriPath);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar_3,"buffer","expectedBuffer",&buffer,&expectedBuffer);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&uriPath);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xf6,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&uriPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if (uriPath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)uriPath._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  Message::Deserialize((Message *)&gtest_ar_3,&error,&buffer);
  std::__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&message.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> *)
             &gtest_ar_3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
  uriPath._M_dataplus._M_p = (pointer)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)&gtest_ar_3,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)
             &message.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>,
             (void **)&uriPath);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&uriPath);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xf9,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&uriPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if (uriPath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)uriPath._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  uriPath._M_dataplus._M_p = uriPath._M_dataplus._M_p & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_3,"error","ErrorCode::kNone",&error,(ErrorCode *)&uriPath);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&uriPath);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xfa,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&uriPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if (uriPath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)uriPath._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  uriPath._M_dataplus._M_p =
       (pointer)((message.
                  super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->mOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  gtest_ar_11.success_ = true;
  gtest_ar_11._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_3,"message->GetOptionNum()","3",(unsigned_long *)&uriPath,
             (int *)&gtest_ar_11);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&uriPath);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xfc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&uriPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if (uriPath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)uriPath._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  Message::GetContentFormat
            ((Error *)&gtest_ar_3,
             message.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&contentFormat);
  gtest_ar_11.success_ = false;
  gtest_ar_11._1_3_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&uriPath,"message->GetContentFormat(contentFormat)","ErrorCode::kNone",
             (Error *)&gtest_ar_3,(ErrorCode *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  if ((char)uriPath._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (uriPath._M_string_length == 0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)uriPath._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xff,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&uriPath._M_string_length);
  uriPath._M_dataplus._M_p._0_4_ = 0x3c;
  testing::internal::
  CmpHelperEQ<ot::commissioner::coap::ContentFormat,ot::commissioner::coap::ContentFormat>
            ((internal *)&gtest_ar_3,"contentFormat","ContentFormat::kCBOR",&contentFormat,
             (ContentFormat *)&uriPath);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&uriPath);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x100,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&uriPath);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if (uriPath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)uriPath._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  uriPath._M_dataplus._M_p = (pointer)&uriPath.field_2;
  uriPath._M_string_length = 0;
  uriPath.field_2._M_local_buf[0] = '\0';
  Message::GetUriPath((Error *)&gtest_ar_3,
                      message.
                      super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&uriPath);
  local_b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_11,"message->GetUriPath(uriPath)","ErrorCode::kNone",
             (Error *)&gtest_ar_3,(ErrorCode *)&local_b0);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_11.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_11.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x103,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_11.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[20]>
            ((internal *)&gtest_ar_3,"uriPath","\"/.well-known/est/rv\"",&uriPath,
             (char (*) [20])"/.well-known/est/rv");
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x106,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((long *)CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  Message::GetAccept((Error *)&gtest_ar_3,
                     message.
                     super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&accept);
  local_b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_11,"message->GetAccept(accept)","ErrorCode::kNone",
             (Error *)&gtest_ar_3,(ErrorCode *)&local_b0);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_11.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)gtest_ar_11.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x109,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_11.message_);
  gtest_ar_11.success_ = true;
  gtest_ar_11._1_3_ = 0;
  testing::internal::
  CmpHelperEQ<ot::commissioner::coap::ContentFormat,ot::commissioner::coap::ContentFormat>
            ((internal *)&gtest_ar_3,"accept","ContentFormat::kCoseSign1",&accept,
             (ContentFormat *)&gtest_ar_11);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if ((undefined8 *)
        CONCAT53(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_5_,
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_3_) == (undefined8 *)0x0) {
      pcVar1 = anon_var_dwarf_307b52 + 9;
    }
    else {
      pcVar1 = *(char **)CONCAT53(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._3_5_,
                                  gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x10a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((long *)CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  std::__cxx11::string::~string((string *)&uriPath);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expectedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&error.mMessage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&message.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_MultipleOptionsSerializationAndDeserialization)
{
    auto      message = std::make_shared<Message>(Type::kConfirmable, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->SetUriPath(".well-known/est/rv/"), ErrorCode::kNone);
    EXPECT_EQ(message->SetContentFormat(ContentFormat::kCBOR), ErrorCode::kNone);
    EXPECT_EQ(message->SetAccept(ContentFormat::kCoseSign1), ErrorCode::kNone);
    EXPECT_EQ(message->GetOptionNum(), 3);
    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);

    auto expectedBuffer = ByteArray{0x40, 0x01,
                                    0x00, 0x00, // header
                                    0xbb, '.',
                                    'w',  'e',
                                    'l',  'l',
                                    '-',  'k',
                                    'n',  'o',
                                    'w',  'n', // uri-path
                                    0x03, 'e',
                                    's',  't', // uri-path
                                    0x02, 'r',
                                    'v',                                              // uri-path
                                    0x11, utils::to_underlying(ContentFormat::kCBOR), // content-format
                                    0x51, utils::to_underlying(ContentFormat::kCoseSign1)};

    EXPECT_EQ(buffer, expectedBuffer);

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 3);

    ContentFormat contentFormat;
    EXPECT_EQ(message->GetContentFormat(contentFormat), ErrorCode::kNone);
    EXPECT_EQ(contentFormat, ContentFormat::kCBOR);

    std::string uriPath;
    EXPECT_EQ(message->GetUriPath(uriPath), ErrorCode::kNone);

    // ".well-known/est/rv/" is normalized to "/.well-known/est/rv"
    EXPECT_EQ(uriPath, "/.well-known/est/rv");

    ContentFormat accept;
    EXPECT_EQ(message->GetAccept(accept), ErrorCode::kNone);
    EXPECT_EQ(accept, ContentFormat::kCoseSign1);
}